

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O1

Var Js::RegexHelper::RegexExecImpl
              (ScriptContext *scriptContext,JavascriptRegExp *regularExpression,
              JavascriptString *input,bool noResult,void *stackAllocationPointer)

{
  RegexPattern *this;
  RecyclableObject *nonMatchValue;
  SparseArraySegmentBase *pSVar1;
  code *pcVar2;
  bool isGlobal;
  bool isSticky;
  bool bVar3;
  uint16 uVar4;
  charcount_t inputLength;
  char16 *input_00;
  JavascriptArray *arr;
  undefined4 *puVar5;
  GroupInfo GVar6;
  Var pvVar7;
  GroupInfo GVar8;
  ScriptContext *scriptContext_00;
  ulong uVar9;
  uint offset;
  ulong uVar10;
  SparseArraySegmentBase *addr;
  
  this = (regularExpression->pattern).ptr;
  GVar6 = (GroupInfo)stackAllocationPointer;
  RegexHelperTrace(scriptContext,Exec,regularExpression,input);
  isGlobal = UnifiedRegex::RegexPattern::IsGlobal(this);
  isSticky = UnifiedRegex::RegexPattern::IsSticky(this);
  scriptContext_00 = (ScriptContext *)input;
  inputLength = JavascriptString::GetLength(input);
  bVar3 = true;
  offset = 0;
  if (isGlobal || isSticky) {
    if (regularExpression->lastIndexOrFlag == 0xfffffffe) {
      scriptContext_00 = (ScriptContext *)regularExpression;
      JavascriptRegExp::CacheLastIndex(regularExpression);
    }
    offset = regularExpression->lastIndexOrFlag;
    if (0x7ffffffe < offset) {
      (regularExpression->lastIndexVar).ptr = (void *)0x0;
      regularExpression->lastIndexOrFlag = 0;
      bVar3 = false;
    }
  }
  if (bVar3) {
    if (inputLength < offset) {
      uVar10 = 0xffffffff;
      uVar9 = 0;
    }
    else {
      input_00 = JavascriptString::GetString(input);
      GVar6.length = 0;
      GVar6.offset = offset;
      scriptContext_00 = scriptContext;
      GVar8 = SimpleMatch(scriptContext,this,input_00,inputLength,offset);
      uVar9 = (ulong)GVar8 & 0xffffffff;
      uVar10 = (ulong)GVar8 >> 0x20;
    }
    GVar8 = (GroupInfo)(uVar10 << 0x20 | uVar9);
    PropagateLastMatchToRegex(scriptContext_00,isGlobal,isSticky,regularExpression,GVar6,GVar8);
    PropagateLastMatchToCtor(scriptContext,regularExpression,input,GVar8,false);
    if ((!noResult) && ((int)uVar10 != -1)) {
      uVar4 = UnifiedRegex::RegexPattern::NumGroups(this);
      arr = JavascriptRegularExpressionResult::Create
                      (stackAllocationPointer,(uint)uVar4,input,scriptContext);
      JavascriptRegularExpressionResult::SetMatch(arr,GVar8);
      if (uVar4 == 0) {
        return arr;
      }
      nonMatchValue =
           (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).undefinedValue.ptr;
      addr = (arr->head).ptr + 1;
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      uVar9 = 0;
      do {
        pSVar1 = (arr->head).ptr;
        if (pSVar1->length + pSVar1->left <= uVar9) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                      ,0x281,
                                      "(groupId < result->GetHead()->left + result->GetHead()->length)"
                                      ,
                                      "groupId < result->GetHead()->left + result->GetHead()->length"
                                     );
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar5 = 0;
        }
        GVar6 = UnifiedRegex::RegexPattern::GetGroup(this,(int)uVar9);
        pvVar7 = GetString(scriptContext,input,nonMatchValue,GVar6);
        Memory::Recycler::WBSetBit((char *)addr);
        *(Var *)addr = pvVar7;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
        uVar9 = uVar9 + 1;
        addr = (SparseArraySegmentBase *)&addr->size;
      } while (uVar4 != uVar9);
      return arr;
    }
  }
  return (((scriptContext->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase)
         .nullValue.ptr;
}

Assistant:

Var RegexHelper::RegexExecImpl(ScriptContext* scriptContext, JavascriptRegExp* regularExpression, JavascriptString* input, bool noResult, void *const stackAllocationPointer)
    {
        UnifiedRegex::RegexPattern* pattern = regularExpression->GetPattern();

#if ENABLE_REGEX_CONFIG_OPTIONS
        RegexHelperTrace(scriptContext, UnifiedRegex::RegexStats::Exec, regularExpression, input);
#endif

        const bool isGlobal = pattern->IsGlobal();
        const bool isSticky = pattern->IsSticky();
        CharCount offset;
        CharCount inputLength = input->GetLength();
        if (!GetInitialOffset(isGlobal, isSticky, regularExpression, inputLength, offset))
        {
            return scriptContext->GetLibrary()->GetNull();
        }

        UnifiedRegex::GroupInfo match; // initially undefined
        if (offset <= inputLength)
        {
            const char16* inputStr = input->GetString();
            match = SimpleMatch(scriptContext, pattern, inputStr, inputLength, offset);
        }

        // else: match remains undefined
        PropagateLastMatch(scriptContext, isGlobal, isSticky, regularExpression, input, match, match, true, true);

        if (noResult || match.IsUndefined())
        {
            return scriptContext->GetLibrary()->GetNull();
        }

        const int numGroups = pattern->NumGroups();
        Assert(numGroups >= 0);
        JavascriptArray* result = CreateExecResult(stackAllocationPointer, scriptContext, numGroups, input, match);
        Var nonMatchValue = NonMatchValue(scriptContext, false);
        Field(Var) *elements = ((SparseArraySegment<Var>*)result->GetHead())->elements;
        for (uint groupId = 0; groupId < (uint)numGroups; groupId++)
        {
            Assert(groupId < result->GetHead()->left + result->GetHead()->length);
            elements[groupId] = GetGroup(scriptContext, pattern, input, nonMatchValue, groupId);
        }
        return result;
    }